

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounddef.cpp
# Opt level: O2

void sdInit(void)

{
  size_t __n;
  int iVar1;
  long *plVar2;
  int i_1;
  long lVar3;
  int *piVar4;
  int *__s;
  int j;
  long lVar5;
  int j_1;
  long *__dest;
  char (*pacVar6) [256];
  int i;
  ulong uVar7;
  int iVar8;
  long *plVar9;
  int i_5;
  char (*__dest_00) [32];
  int i_2;
  long lVar10;
  char s [256];
  
  soundmem = (uchar *)operator_new__(0x1b2d7);
  __dest = (long *)((long)soundmem + 0x200);
  __dest_00 = patchnames;
  uVar7 = 0;
  plVar9 = __dest;
  patchoffsets = (long *)soundmem;
  do {
    plVar2 = __dest;
    if (uVar7 != 0x80) {
      if (uVar7 == 0x81) {
        for (lVar3 = 0; lVar3 != 0x17; lVar3 = lVar3 + 1) {
          globals[lVar3] = "@@ \x7fdP@@"[lVar3];
        }
        memcpy(v2clipboard,"@@\x01",0x357);
        builtin_strncpy(v2clipname,"Init Patch",0xb);
        v2version = 0;
        iVar8 = 0;
        for (lVar3 = 0; lVar3 != 0x10b0; lVar3 = lVar3 + 0x30) {
          iVar1 = *(int *)((long)&v2parms[0].version + lVar3);
          if (iVar8 < iVar1) {
            iVar8 = iVar1;
            v2version = iVar1;
          }
        }
        for (lVar3 = 0; lVar3 != 0x450; lVar3 = lVar3 + 0x30) {
          iVar1 = *(int *)((long)&v2gparms[0].version + lVar3);
          if (iVar8 < iVar1) {
            iVar8 = iVar1;
            v2version = iVar1;
          }
        }
        lVar3 = (long)iVar8;
        __n = lVar3 * 4 + 4;
        uVar7 = 0xffffffffffffffff;
        if (-2 < iVar8) {
          uVar7 = __n;
        }
        piVar4 = (int *)operator_new__(uVar7);
        v2vsizes = piVar4;
        __s = (int *)operator_new__(uVar7);
        v2gsizes = __s;
        memset(piVar4,0,__n);
        memset(__s,0,__n);
        for (lVar10 = 0; lVar10 != 0x59; lVar10 = lVar10 + 1) {
          iVar8 = v2parms[lVar10].version;
          for (lVar5 = lVar3; iVar8 <= lVar5; lVar5 = lVar5 + -1) {
            piVar4[lVar5] = piVar4[lVar5] + 1;
          }
        }
        for (lVar10 = 0; lVar10 != 0x17; lVar10 = lVar10 + 1) {
          iVar8 = v2gparms[lVar10].version;
          for (lVar5 = lVar3; iVar8 <= lVar5; lVar5 = lVar5 + -1) {
            __s[lVar5] = __s[lVar5] + 1;
          }
        }
        for (lVar10 = 0; lVar10 <= lVar3; lVar10 = lVar10 + 1) {
          piVar4[lVar10] = piVar4[lVar10] + 0x2fe;
        }
        piVar4 = (int *)operator_new__(0x44);
        iVar8 = 0;
        v2topics2 = piVar4;
        for (lVar3 = 0; lVar3 != 0x198; lVar3 = lVar3 + 0x18) {
          *piVar4 = iVar8;
          iVar8 = iVar8 + *(int *)((long)&v2topics[0].no + lVar3);
          piVar4 = piVar4 + 1;
        }
        piVar4 = (int *)operator_new__(0x14);
        iVar8 = 0;
        v2gtopics2 = piVar4;
        for (lVar3 = 0; lVar3 != 0x78; lVar3 = lVar3 + 0x18) {
          *piVar4 = iVar8;
          iVar8 = iVar8 + *(int *)((long)&v2gtopics[0].no + lVar3);
          piVar4 = piVar4 + 1;
        }
        pacVar6 = speech;
        memset(speech[0] + 0x40,0,0x3fc0);
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
          speechptrs[lVar3] = *pacVar6;
          pacVar6 = pacVar6 + 1;
        }
        memcpy(speech,"!DHAX_ !kwIH_k !br4AH_UHn !fAA_ks !jAH_mps !OW!vER_ !DHAX_ !lEY!zIY_ !dAA_g "
               ,0x4d);
        return;
      }
      patchoffsets[uVar7] = (long)plVar9 - (long)soundmem;
      sprintf(s,"Init Patch #%03d",uVar7 & 0xffffffff);
      strcpy(*__dest_00,s);
      plVar2 = (long *)editmem;
    }
    editmem = (uchar *)plVar2;
    memcpy(__dest,"@@\x01",0x357);
    __dest = (long *)((long)__dest + 0x357);
    uVar7 = uVar7 + 1;
    __dest_00 = __dest_00 + 1;
    plVar9 = (long *)((long)plVar9 + 0x357);
  } while( true );
}

Assistant:

void sdInit()
{
    soundmem = new unsigned char [smsize + v2soundsize];
    patchoffsets = (long *)soundmem;
    unsigned char *sptr = soundmem + 128*4;

    // printf("sound size: %d\n",v2nparms);
    char s[256];

    for (int i = 0; i < 129; i++)
    {
        if (i < 128)
        {
            patchoffsets[i] = (long)(sptr - soundmem);
            sprintf(s, "Init Patch #%03d", i);
            strcpy(patchnames[i], s);
        } else
            editmem = sptr;
        memcpy(sptr, v2initsnd, v2soundsize);
        sptr += v2soundsize;
    }
    for (int i = 0; i < v2ngparms; i++)
        globals[i] = v2initglobs[i];

    memcpy(v2clipboard, v2initsnd, v2soundsize);
    sprintf(v2clipname, "Init Patch");

    // init version control
    v2version = 0;
    for (int i = 0; i < v2nparms; i++)
        if (v2parms[i].version > v2version)
            v2version = v2parms[i].version;
    for (int i = 0; i < v2ngparms; i++)
        if (v2gparms[i].version > v2version)
            v2version = v2gparms[i].version;

    v2vsizes = new int[v2version + 1];
    v2gsizes = new int[v2version + 1];
    memset(v2vsizes, 0, (v2version + 1)*sizeof(int));
    memset(v2gsizes, 0, (v2version + 1)*sizeof(int));
    for (int i = 0; i < v2nparms; i++)
    {
        const V2PARAM &p = v2parms[i];
//        ATLASSERT(p.version<=v2version);
        for (int j = v2version; j >= p.version; j--)
            v2vsizes[j]++;
    }
    for (int i = 0; i < v2ngparms; i++)
    {
        const V2PARAM &p = v2gparms[i];
        //ATLASSERT(p.version<=v2version);
        for (int j = v2version; j >= p.version; j--)
            v2gsizes[j]++;
    }
//ATLASSERT(v2vsizes[v2version]==v2nparms);

    for (int i = 0; i <= v2version; i++)
    {
        // printf("size of version %d sound bank: %d params, %d globals\n",i,v2vsizes[i],v2gsizes[i]);
        v2vsizes[i] += 1 + 255*3;
    }

    v2topics2 = new int[v2ntopics];
    int p = 0;
    for (int i = 0; i < v2ntopics; i++)
    {
        v2topics2[i] = p;
        p += v2topics[i].no;
    }

    v2gtopics2 = new int[v2ngtopics];
    p = 0;
    for (int i = 0; i < v2ngtopics; i++)
    {
        v2gtopics2[i] = p;
        p += v2gtopics[i].no;
    }

#ifdef RONAN
    memset(speech, 0, 64*256);
    for (int i = 0; i < 64; i++)
        speechptrs[i] = speech[i];

    strcpy(speech[0], "!DHAX_ !kwIH_k !br4AH_UHn !fAA_ks !jAH_mps !OW!vER_ !DHAX_ !lEY!zIY_ !dAA_g ");
#endif
}